

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O1

ProgramContext * __thiscall
deqp::gles3::Performance::ShaderCompilerTextureCase::generateShaderData
          (ProgramContext *__return_storage_ptr__,ShaderCompilerTextureCase *this,int measurementNdx
          )

{
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  *pvVar1;
  ConditionalUsage CVar2;
  ConditionalType CVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int i;
  uint uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  long *plVar9;
  int iVar10;
  pointer pAVar11;
  size_type *psVar12;
  long lVar13;
  uint cacheAvoidanceID;
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  *pvVar14;
  ConditionalType in_R8D;
  int iVar15;
  ProgramContext *result;
  Vector<float,_16> result_1;
  string nameSpec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  ProgramContext *local_2c0;
  undefined1 local_2b8 [24];
  long lStack_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  float local_278 [18];
  ConditionalType local_230;
  ConditionalUsage local_22c;
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  local_228;
  undefined1 local_208 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined1 local_1c8 [24];
  undefined8 uStack_1b0;
  undefined1 local_1a8 [36];
  float fStack_184;
  long lStack_180;
  size_type local_178;
  float afStack_170 [2];
  float local_168 [2];
  float afStack_160 [2];
  float local_158 [2];
  float afStack_150 [6];
  ios_base local_138 [264];
  
  cacheAvoidanceID = (this->super_ShaderCompilerCase).m_startHash;
  if ((this->super_ShaderCompilerCase).m_avoidCache == true) {
    uVar7 = ((uint)measurementNdx >> 0x10 ^ measurementNdx ^ 0x3d) * 9;
    uVar7 = (uVar7 >> 4 ^ uVar7) * 0x27d4eb2d;
    cacheAvoidanceID = cacheAvoidanceID ^ uVar7 ^ uVar7 >> 0xf;
  }
  local_2c0 = __return_storage_ptr__;
  getNameSpecialization_abi_cxx11_
            ((string *)&local_1e8,(Performance *)(ulong)cacheAvoidanceID,measurementNdx);
  (local_2c0->vertShaderSource)._M_dataplus._M_p = (pointer)&(local_2c0->vertShaderSource).field_2;
  (local_2c0->vertShaderSource)._M_string_length = 0;
  (local_2c0->vertShaderSource).field_2._M_local_buf[0] = '\0';
  paVar8 = &(local_2c0->fragShaderSource).field_2;
  (local_2c0->fragShaderSource)._M_dataplus._M_p = (pointer)paVar8;
  (local_2c0->fragShaderSource)._M_string_length = 0;
  (local_2c0->fragShaderSource).field_2._M_local_buf[0] = '\0';
  (local_2c0->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_2c0->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_2c0->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_2c0->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_2c0->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_2c0->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  textureLookupVertexTemplate_abi_cxx11_
            ((string *)&local_298,(Performance *)(ulong)this->m_conditionalUsage,
             this->m_conditionalType,(ConditionalType)paVar8);
  specializeShaderSource
            ((string *)local_1a8,(string *)&local_298,cacheAvoidanceID,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=((string *)local_2c0,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_allocated_capacity != &local_288) {
    operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1);
  }
  textureLookupFragmentTemplate_abi_cxx11_
            ((string *)&local_298,(Performance *)(ulong)(uint)this->m_numLookups,
             this->m_conditionalUsage,this->m_conditionalType,in_R8D);
  paVar8 = &local_298;
  specializeShaderSource
            ((string *)local_1a8,(string *)paVar8,cacheAvoidanceID,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=((string *)&local_2c0->fragShaderSource,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_allocated_capacity != &local_288) {
    operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1);
  }
  CVar2 = this->m_conditionalUsage;
  CVar3 = this->m_conditionalType;
  local_2b8._0_8_ = (pointer)0x0;
  local_2b8._8_8_ = (pointer)0x0;
  local_2b8._16_8_ = (pointer)0x0;
  std::operator+(&local_2e0,"a_position",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8);
  local_208._0_8_ = (pointer)0xbf800000bf800000;
  local_208._8_8_ = (pointer)0x3f80000000000000;
  local_228.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f800000bf800000;
  local_228.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
  pvVar1 = (vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
            *)(local_1c8 + 0x10);
  local_1c8._16_8_ = (pointer)0xbf8000003f800000;
  uStack_1b0 = 0x3f80000000000000;
  local_1c8._0_8_ = &DAT_3f8000003f800000;
  local_1c8._8_8_ = (pointer)0x3f80000000000000;
  local_298._M_allocated_capacity = 0;
  local_298._8_8_ = 0;
  local_288._M_allocated_capacity = 0;
  local_288._8_8_ = 0;
  local_278[0] = 0.0;
  local_278[1] = 0.0;
  local_278[2] = 0.0;
  local_278[3] = 0.0;
  local_278[4] = 0.0;
  local_278[5] = 0.0;
  local_278[6] = 0.0;
  local_278[7] = 0.0;
  lVar13 = 0;
  do {
    iVar10 = (int)lVar13;
    pvVar14 = (vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
               *)local_208;
    if (((iVar10 != 0) && (pvVar14 = &local_228, iVar10 != 1)) &&
       (pvVar14 = (vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                   *)local_1c8, iVar10 == 2)) {
      pvVar14 = pvVar1;
    }
    uVar4 = *(undefined4 *)
             ((long)&(pvVar14->
                     super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                     )._M_impl.super__Vector_impl_data._M_start + 4);
    uVar5 = *(undefined4 *)
             &(pvVar14->
              super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    uVar6 = *(undefined4 *)
             ((long)&(pvVar14->
                     super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                     )._M_impl.super__Vector_impl_data._M_finish + 4);
    *(undefined4 *)paVar8 =
         *(undefined4 *)
          &(pvVar14->
           super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
           )._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)paVar8 + 4) = uVar4;
    *(undefined4 *)(paVar8->_M_local_buf + 8) = uVar5;
    *(undefined4 *)(paVar8->_M_local_buf + 0xc) = uVar6;
    lVar13 = lVar13 + 1;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(paVar8->_M_local_buf + 0x10);
  } while (lVar13 != 4);
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a8,local_2e0._M_dataplus._M_p,
             local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
  local_158[0] = local_278[4];
  local_158[1] = local_278[5];
  afStack_150[0] = local_278[6];
  afStack_150[1] = local_278[7];
  local_168[0] = local_278[0];
  local_168[1] = local_278[1];
  afStack_160[0] = local_278[2];
  afStack_160[1] = local_278[3];
  local_178 = local_288._M_allocated_capacity;
  afStack_170[0] = (float)local_288._8_4_;
  afStack_170[1] = (float)local_288._12_4_;
  stack0xfffffffffffffe78 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_298._M_allocated_capacity;
  lStack_180 = local_298._8_8_;
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>
            ((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
              *)local_2b8,(AttribSpec *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_2e0,"a_coords",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8);
  local_208._0_8_ = (pointer)0x0;
  local_208._8_8_ = (pointer)0x0;
  local_228.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f80000000000000;
  local_228.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8._16_8_ = (pointer)0x3f800000;
  uStack_1b0 = 0;
  local_1c8._0_8_ = &DAT_3f8000003f800000;
  local_1c8._8_8_ = (pointer)0x0;
  paVar8 = &local_298;
  local_298._M_allocated_capacity = 0;
  local_298._8_8_ = 0;
  local_288._M_allocated_capacity = 0;
  local_288._8_8_ = 0;
  local_278[0] = 0.0;
  local_278[1] = 0.0;
  local_278[2] = 0.0;
  local_278[3] = 0.0;
  local_278[4] = 0.0;
  local_278[5] = 0.0;
  local_278[6] = 0.0;
  local_278[7] = 0.0;
  lVar13 = 0;
  do {
    iVar10 = (int)lVar13;
    pvVar14 = (vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
               *)local_208;
    if (((iVar10 != 0) && (pvVar14 = &local_228, iVar10 != 1)) &&
       (pvVar14 = (vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                   *)local_1c8, iVar10 == 2)) {
      pvVar14 = pvVar1;
    }
    uVar4 = *(undefined4 *)
             ((long)&(pvVar14->
                     super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                     )._M_impl.super__Vector_impl_data._M_start + 4);
    uVar5 = *(undefined4 *)
             &(pvVar14->
              super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    uVar6 = *(undefined4 *)
             ((long)&(pvVar14->
                     super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                     )._M_impl.super__Vector_impl_data._M_finish + 4);
    *(undefined4 *)paVar8 =
         *(undefined4 *)
          &(pvVar14->
           super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
           )._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)(paVar8->_M_local_buf + 4) = uVar4;
    *(undefined4 *)(&paVar8->_M_allocated_capacity + 1) = uVar5;
    *(undefined4 *)(paVar8->_M_local_buf + 0xc) = uVar6;
    lVar13 = lVar13 + 1;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar8->_M_allocated_capacity + 2);
  } while (lVar13 != 4);
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a8,local_2e0._M_dataplus._M_p,
             local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
  local_158[0] = local_278[4];
  local_158[1] = local_278[5];
  afStack_150[0] = local_278[6];
  afStack_150[1] = local_278[7];
  local_168[0] = local_278[0];
  local_168[1] = local_278[1];
  afStack_160[0] = local_278[2];
  afStack_160[1] = local_278[3];
  local_178 = local_288._M_allocated_capacity;
  afStack_170[0] = (float)local_288._8_4_;
  afStack_170[1] = (float)local_288._12_4_;
  stack0xfffffffffffffe78 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_298._M_allocated_capacity;
  lStack_180 = local_298._8_8_;
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>
            ((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
              *)local_2b8,(AttribSpec *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((CVar2 != CONDITIONAL_USAGE_NONE) && (CVar3 == CONDITIONAL_TYPE_DYNAMIC)) {
    std::operator+(&local_2e0,"a_condition",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8);
    lVar13 = 0;
    do {
      *(undefined4 *)(local_208 + lVar13 * 4) = 0x3f800000;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    lVar13 = 0;
    do {
      *(undefined4 *)
       ((long)&local_228.
               super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar13 * 4) = 0x3f800000;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    lVar13 = 0;
    do {
      *(undefined4 *)(local_1c8 + lVar13 * 4 + 0x10) = 0x3f800000;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    lVar13 = 0;
    do {
      *(undefined4 *)(local_1c8 + lVar13 * 4) = 0x3f800000;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    paVar8 = &local_298;
    local_278[4] = 0.0;
    local_278[5] = 0.0;
    local_278[6] = 0.0;
    local_278[7] = 0.0;
    local_278[0] = 0.0;
    local_278[1] = 0.0;
    local_278[2] = 0.0;
    local_278[3] = 0.0;
    local_288._M_allocated_capacity = 0;
    local_288._8_8_ = 0;
    local_298._M_allocated_capacity = 0;
    local_298._8_8_ = 0;
    lVar13 = 0;
    do {
      iVar10 = (int)lVar13;
      pvVar14 = &local_228;
      if (((iVar10 != 1) &&
          (pvVar14 = (vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                      *)local_208, iVar10 != 0)) &&
         (pvVar14 = (vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                     *)local_1c8, iVar10 == 2)) {
        pvVar14 = pvVar1;
      }
      uVar4 = *(undefined4 *)
               ((long)&(pvVar14->
                       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                       )._M_impl.super__Vector_impl_data._M_start + 4);
      uVar5 = *(undefined4 *)
               &(pvVar14->
                super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      uVar6 = *(undefined4 *)
               ((long)&(pvVar14->
                       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                       )._M_impl.super__Vector_impl_data._M_finish + 4);
      *(undefined4 *)paVar8 =
           *(undefined4 *)
            &(pvVar14->
             super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
             )._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)(paVar8->_M_local_buf + 4) = uVar4;
      *(undefined4 *)(&paVar8->_M_allocated_capacity + 1) = uVar5;
      *(undefined4 *)(paVar8->_M_local_buf + 0xc) = uVar6;
      lVar13 = lVar13 + 1;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(&paVar8->_M_allocated_capacity + 2);
    } while (lVar13 != 4);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_2e0._M_dataplus._M_p,
               local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
    local_158[0] = local_278[4];
    local_158[1] = local_278[5];
    afStack_150[0] = local_278[6];
    afStack_150[1] = local_278[7];
    local_168[0] = local_278[0];
    local_168[1] = local_278[1];
    afStack_160[0] = local_278[2];
    afStack_160[1] = local_278[3];
    local_178 = local_288._M_allocated_capacity;
    afStack_170[0] = (float)local_288._8_4_;
    afStack_170[1] = (float)local_288._12_4_;
    stack0xfffffffffffffe78 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_298._M_allocated_capacity;
    lStack_180 = local_298._8_8_;
    std::
    vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
    ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>
              ((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
                *)local_2b8,(AttribSpec *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
  }
  iVar15 = 0;
  local_1a8._0_8_ =
       (local_2c0->vertexAttributes).
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       (local_2c0->vertexAttributes).
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1a8._16_8_ =
       (local_2c0->vertexAttributes).
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_2c0->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2b8._0_8_;
  (local_2c0->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2b8._8_8_;
  (local_2c0->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2b8._16_8_;
  local_2b8._0_8_ = (pointer)0x0;
  local_2b8._8_8_ = (pointer)0x0;
  local_2b8._16_8_ = (pointer)0x0;
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
             *)local_1a8);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
             *)local_2b8);
  iVar10 = this->m_numLookups;
  local_22c = this->m_conditionalUsage;
  local_230 = this->m_conditionalType;
  local_228.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (0 < iVar10) {
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<((ostringstream *)local_1a8,iVar15);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,0x1c24c42);
      pAVar11 = (pointer)(plVar9 + 2);
      if ((pointer)*plVar9 == pAVar11) {
        local_2b8._16_8_ = (pAVar11->name)._M_dataplus._M_p;
        lStack_2a0 = plVar9[3];
        local_2b8._0_8_ = (pointer)(local_2b8 + 0x10);
      }
      else {
        local_2b8._16_8_ = (pAVar11->name)._M_dataplus._M_p;
        local_2b8._0_8_ = (pointer)*plVar9;
      }
      local_2b8._8_8_ = plVar9[1];
      *plVar9 = (long)pAVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::_M_append(local_2b8,local_1e8._M_allocated_capacity);
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_2e0.field_2._M_allocated_capacity = *psVar12;
        local_2e0.field_2._8_4_ = (undefined4)plVar9[3];
        local_2e0.field_2._12_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
      }
      else {
        local_2e0.field_2._M_allocated_capacity = *psVar12;
        local_2e0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_2e0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      local_298._M_allocated_capacity = (size_type)&local_288;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,local_2e0._M_dataplus._M_p,
                 local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
      local_278[0] = 8.40779e-45;
      lVar13 = 9;
      do {
        *(float *)((long)&local_298 + lVar13 * 4) = (float)iVar15;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x19);
      std::
      vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
      ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>
                (&local_228,(UniformSpec *)&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_allocated_capacity != &local_288) {
        operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_2b8._0_8_ != (pointer)(local_2b8 + 0x10)) {
        operator_delete((void *)local_2b8._0_8_,
                        (ulong)((long)&(((string *)local_2b8._16_8_)->_M_dataplus)._M_p + 1));
      }
      if ((pointer)local_208._0_8_ != (pointer)(local_208 + 0x10)) {
        operator_delete((void *)local_208._0_8_,
                        (ulong)((long)&(((string *)local_208._16_8_)->_M_dataplus)._M_p + 1));
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 != iVar10);
  }
  if ((local_22c != CONDITIONAL_USAGE_NONE) && (local_230 == CONDITIONAL_TYPE_UNIFORM)) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_298,
                   "u_condition",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_298._M_allocated_capacity,
               local_298._8_8_ + local_298._M_allocated_capacity);
    stack0xfffffffffffffe78 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)((ulong)stack0xfffffffffffffe78 & 0xffffffff00000000);
    lVar13 = 9;
    do {
      *(undefined4 *)(local_1a8 + lVar13 * 4) = 0x3f800000;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x19);
    std::
    vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
    ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>
              (&local_228,(UniformSpec *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_allocated_capacity != &local_288) {
      operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1);
    }
  }
  local_1a8._0_8_ =
       (local_2c0->uniforms).
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       (local_2c0->uniforms).
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1a8._16_8_ =
       (local_2c0->uniforms).
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_2c0->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_228.
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (local_2c0->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_228.
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (local_2c0->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_228.
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_228.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector((vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
             *)local_1a8);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector(&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_allocated_capacity != &local_1d8) {
    operator_delete((void *)local_1e8._M_allocated_capacity,local_1d8._M_allocated_capacity + 1);
  }
  return local_2c0;
}

Assistant:

ShaderCompilerCase::ProgramContext ShaderCompilerTextureCase::generateShaderData (int measurementNdx) const
{
	deUint32		specID		= getSpecializationID(measurementNdx);
	string			nameSpec	= getNameSpecialization(specID);
	ProgramContext	result;

	result.vertShaderSource		= specializeShaderSource(textureLookupVertexTemplate(m_conditionalUsage, m_conditionalType), specID, SHADER_VALIDITY_VALID);
	result.fragShaderSource		= specializeShaderSource(textureLookupFragmentTemplate(m_numLookups, m_conditionalUsage, m_conditionalType), specID, SHADER_VALIDITY_VALID);
	result.vertexAttributes		= textureLookupShaderAttributes(nameSpec, m_conditionalUsage, m_conditionalType);
	result.uniforms				= textureLookupShaderUniforms(nameSpec, m_numLookups, m_conditionalUsage, m_conditionalType);

	return result;
}